

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

MDString * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::MDString,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>
          (LLVMContext *this,Module **u,
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *u_1)

{
  Module *module;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  MDString *local_30;
  MDString *t;
  MDString *mem;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *u_local_1;
  Module **u_local;
  LLVMContext *this_local;
  
  mem = (MDString *)u_1;
  u_local_1 = (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)u
  ;
  u_local = (Module **)this;
  local_30 = (MDString *)allocate(this,0x30,8);
  t = local_30;
  if (local_30 == (MDString *)0x0) {
    std::terminate();
  }
  module = (Module *)(u_local_1->_M_dataplus)._M_p;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&local_50,
               (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
               mem);
  MDString::MDString(local_30,module,&local_50);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  ~basic_string(&local_50);
  append_typed_destructor<LLVMBC::MDString>(this,local_30);
  return local_30;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}